

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O1

int __thiscall ComplexType::fromBuffer(ComplexType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  shared_ptr<BER_CONTAINER> newObj;
  uint local_54;
  _func_int **local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  uVar3 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar3) {
    pbVar5 = buf + uVar3;
    uVar4 = 1;
    do {
      iVar1 = (this->super_BER_CONTAINER)._length;
      if ((max_len < uVar4) || ((ulong)(long)iVar1 <= uVar4)) {
        return iVar1 + 2;
      }
      createObjectForType((ComplexType *)&local_50,(uint)*pbVar5);
      if (local_50 == (_func_int **)0x0) {
        local_54 = 0xfffffff2;
        bVar2 = false;
      }
      else {
        uVar3 = (**(code **)(*local_50 + 0x20))(local_50,pbVar5,max_len - uVar4);
        bVar2 = (int)uVar3 >= 0;
        if ((int)uVar3 < 0) {
          local_54 = 0xfffffff3;
        }
        else {
          addValueToList((ComplexType *)&stack0xffffffffffffffc0,(shared_ptr<BER_CONTAINER> *)this);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          pbVar5 = pbVar5 + uVar3;
          uVar4 = uVar4 + uVar3;
          bVar2 = true;
        }
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      uVar3 = local_54;
    } while (bVar2);
  }
  local_54 = uVar3;
  return local_54;
}

Assistant:

int ComplexType::fromBuffer(const uint8_t *buf, size_t max_len){
    int j = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(j);
    const uint8_t* ptr = buf + j;

    size_t i = 1;
    while(i < (size_t)_length && i <= max_len){
        ASN_TYPE valueType = (ASN_TYPE)*ptr;

        auto newObj = ComplexType::createObjectForType(valueType);
        if(!newObj){
            SNMP_LOGD("Couldn't create object of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_UNKNOWN_TYPE;
        }

        int used_length = newObj->fromBuffer(ptr, max_len - i);
        if(used_length < 0){
            // Problem de-serialising
            SNMP_LOGD("Problem deserialising structure of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_PROBLEM_DESERIALISING;
        }

        addValueToList(newObj);

        ptr += used_length; 
        i += used_length;
    }
    return _length + 2;
}